

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsNumberToDouble(JsValueRef value,double *asDouble)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dVar4;
  DebugCheckNoException local_30;
  DebugCheckNoException __debugCheckNoException;
  
  if (value == (JsValueRef)0x0) {
    return JsErrorInvalidArgument;
  }
  if (asDouble == (double *)0x0) {
    return JsErrorNullArgument;
  }
  local_30.hasException = true;
  local_30.__exceptionCheck = ExceptionCheck::Save();
  if (((ulong)value & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)value & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)value & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)value >> 0x32 == 0) {
        *asDouble = 0.0;
        local_30.hasException = false;
        DebugCheckNoException::~DebugCheckNoException(&local_30);
        return JsErrorInvalidArgument;
      }
      dVar4 = (double)((ulong)value ^ 0xfffc000000000000);
      goto LAB_0036c837;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  dVar4 = (double)(int)value;
LAB_0036c837:
  *asDouble = dVar4;
  local_30.hasException = false;
  DebugCheckNoException::~DebugCheckNoException(&local_30);
  return JsNoError;
}

Assistant:

CHAKRA_API JsNumberToDouble(_In_ JsValueRef value, _Out_ double *asDouble)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(asDouble);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (Js::TaggedInt::Is(value))
        {
            *asDouble = Js::TaggedInt::ToDouble(value);
        }